

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

uint64_t __thiscall slang::ast::Type::getBitstreamWidth(Type *this)

{
  bitwidth_t bVar1;
  ClassType *this_00;
  Type *pTVar2;
  
  this_00 = (ClassType *)getCanonicalType(this);
  switch((this_00->super_Type).super_Symbol.kind) {
  case FixedSizeUnpackedArrayType:
    pTVar2 = (Type *)(this_00->super_Scope).firstMember;
    break;
  default:
    bVar1 = getBitWidth((Type *)this_00);
    pTVar2 = (Type *)(ulong)bVar1;
    break;
  case UnpackedStructType:
  case UnpackedUnionType:
    pTVar2 = this_00->baseClass;
    break;
  case ClassType:
    if ((this_00->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged == false) {
      ClassType::computeSize(this_00);
    }
    pTVar2 = (Type *)(this_00->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>
                     ._M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value;
  }
  return (uint64_t)pTVar2;
}

Assistant:

uint64_t Type::getBitstreamWidth() const {
    auto& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::FixedSizeUnpackedArrayType:
            return ct.as<FixedSizeUnpackedArrayType>().bitstreamWidth;
        case SymbolKind::UnpackedStructType:
            return ct.as<UnpackedStructType>().bitstreamWidth;
        case SymbolKind::UnpackedUnionType:
            return ct.as<UnpackedUnionType>().bitstreamWidth;
        case SymbolKind::ClassType:
            return ct.as<ClassType>().getBitstreamWidth();
        default:
            return ct.getBitWidth();
    }
}